

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O0

void __thiscall cmFindCommon::SelectDefaultMacMode(cmFindCommon *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  undefined1 local_88 [8];
  string fab;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  string ff;
  cmFindCommon *this_local;
  
  pcVar1 = (this->super_cmCommand).Makefile;
  ff.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"CMAKE_FIND_FRAMEWORK",&local_51);
  pcVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,pcVar3,(allocator *)(fab.field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator((allocator<char> *)(fab.field_2._M_local_buf + 0xb));
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"NEVER");
  if (bVar2) {
    this->SearchFrameworkLast = false;
    this->SearchFrameworkFirst = false;
    this->SearchFrameworkOnly = false;
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30,"ONLY");
    if (bVar2) {
      this->SearchFrameworkLast = false;
      this->SearchFrameworkFirst = false;
      this->SearchFrameworkOnly = true;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,"FIRST");
      if (bVar2) {
        this->SearchFrameworkLast = false;
        this->SearchFrameworkFirst = true;
        this->SearchFrameworkOnly = false;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_30,"LAST");
        if (bVar2) {
          this->SearchFrameworkLast = true;
          this->SearchFrameworkFirst = false;
          this->SearchFrameworkOnly = false;
        }
      }
    }
  }
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"CMAKE_FIND_APPBUNDLE",&local_a9);
  pcVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_88,pcVar3,&local_aa);
  std::allocator<char>::~allocator((allocator<char> *)&local_aa);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_88,"NEVER");
  if (bVar2) {
    this->SearchAppBundleLast = false;
    this->SearchAppBundleFirst = false;
    this->SearchAppBundleOnly = false;
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88,"ONLY");
    if (bVar2) {
      this->SearchAppBundleLast = false;
      this->SearchAppBundleFirst = false;
      this->SearchAppBundleOnly = true;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_88,"FIRST");
      if (bVar2) {
        this->SearchAppBundleLast = false;
        this->SearchAppBundleFirst = true;
        this->SearchAppBundleOnly = false;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_88,"LAST");
        if (bVar2) {
          this->SearchAppBundleLast = true;
          this->SearchAppBundleFirst = false;
          this->SearchAppBundleOnly = false;
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmFindCommon::SelectDefaultMacMode()
{
  std::string ff = this->Makefile->GetSafeDefinition("CMAKE_FIND_FRAMEWORK");
  if (ff == "NEVER") {
    this->SearchFrameworkLast = false;
    this->SearchFrameworkFirst = false;
    this->SearchFrameworkOnly = false;
  } else if (ff == "ONLY") {
    this->SearchFrameworkLast = false;
    this->SearchFrameworkFirst = false;
    this->SearchFrameworkOnly = true;
  } else if (ff == "FIRST") {
    this->SearchFrameworkLast = false;
    this->SearchFrameworkFirst = true;
    this->SearchFrameworkOnly = false;
  } else if (ff == "LAST") {
    this->SearchFrameworkLast = true;
    this->SearchFrameworkFirst = false;
    this->SearchFrameworkOnly = false;
  }

  std::string fab = this->Makefile->GetSafeDefinition("CMAKE_FIND_APPBUNDLE");
  if (fab == "NEVER") {
    this->SearchAppBundleLast = false;
    this->SearchAppBundleFirst = false;
    this->SearchAppBundleOnly = false;
  } else if (fab == "ONLY") {
    this->SearchAppBundleLast = false;
    this->SearchAppBundleFirst = false;
    this->SearchAppBundleOnly = true;
  } else if (fab == "FIRST") {
    this->SearchAppBundleLast = false;
    this->SearchAppBundleFirst = true;
    this->SearchAppBundleOnly = false;
  } else if (fab == "LAST") {
    this->SearchAppBundleLast = true;
    this->SearchAppBundleFirst = false;
    this->SearchAppBundleOnly = false;
  }
}